

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O1

void embree::emitXML(FileName *fileName,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  char cVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  ofstream cout;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(fileName->filename)._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    emitXML((ostream *)&local_228,xml,0);
    std::ofstream::close();
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _XrmGetResource;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  std::operator+(&local_248,"cannot open file ",&local_268);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_288 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_288 == plVar4) {
    local_278 = *plVar4;
    lStack_270 = plVar3[3];
    local_288 = &local_278;
  }
  else {
    local_278 = *plVar4;
  }
  local_280 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_288);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void emitXML(const FileName& fileName, const Ref<XML>& xml)
  {
    std::ofstream cout(fileName.c_str());
    if (!cout.is_open()) THROW_RUNTIME_ERROR("cannot open file " + fileName.str() + " for writing");
    emitXML(cout,xml);
    cout.close();
  }